

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O3

int mbedtls_timing_self_test(int verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  __time_t _Var7;
  __suseconds_t _Var8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  uint extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar11;
  long lVar12;
  unsigned_long msec;
  unsigned_long msec_00;
  char *__s;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  timeval offset;
  timeval offset_2;
  timeval local_88 [2];
  undefined8 local_68;
  unsigned_long local_58;
  ulong local_50;
  timeval local_48;
  
  if (verbose != 0) {
    puts("  TIMING tests note: will take some time!");
    printf("  TIMING test #1 (set_alarm / get_timer): ");
  }
  lVar12 = 1;
  do {
    gettimeofday(local_88,(__timezone_ptr_t)0x0);
    _Var8 = local_88[0].tv_usec;
    _Var7 = local_88[0].tv_sec;
    mbedtls_timing_alarmed = 0;
    signal(0xe,sighandler);
    alarm((uint)lVar12);
    do {
    } while (mbedtls_timing_alarmed == 0);
    gettimeofday(local_88,(__timezone_ptr_t)0x0);
    uVar11 = (local_88[0].tv_usec - _Var8) / 1000 + (local_88[0].tv_sec - _Var7) * 1000;
    if ((uVar11 < (ulong)(lVar12 * 800)) || (lVar12 * 0x4b0 + 300U < uVar11)) goto LAB_0014404f;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  if (verbose != 0) {
    puts("passed");
    printf("  TIMING test #2 (set/get_delay        ): ");
  }
  msec = 0x96;
  iVar10 = 400;
  uVar11 = 200;
  do {
    local_50 = uVar11 >> 2;
    msec_00 = 0x32;
    uVar14 = 0;
    local_58 = msec;
    do {
      local_68 = CONCAT44(iVar10 + (int)uVar14,(int)uVar11);
      gettimeofday(&local_48,(__timezone_ptr_t)0x0);
      local_88[0].tv_sec = local_48.tv_sec;
      local_88[0].tv_usec = local_48.tv_usec;
      busy_msleep(uVar11 - (uVar11 >> 3));
      iVar9 = mbedtls_timing_get_delay(local_88);
      if (iVar9 != 0) goto LAB_0014404f;
      busy_msleep(local_50);
      iVar9 = mbedtls_timing_get_delay(local_88);
      if (iVar9 != 1) goto LAB_0014404f;
      busy_msleep(msec);
      iVar9 = mbedtls_timing_get_delay(local_88);
      if (iVar9 != 1) goto LAB_0014404f;
      busy_msleep(msec_00);
      iVar9 = mbedtls_timing_get_delay(local_88);
      if (iVar9 != 2) goto LAB_0014404f;
      msec = msec + 0xaf;
      uVar14 = uVar14 + 200;
      msec_00 = msec_00 + 0x32;
    } while (uVar14 < 0xc9);
    msec = local_58 - 0x19;
    iVar10 = iVar10 + 200;
    bVar16 = uVar11 < 0xc9;
    uVar11 = uVar11 + 200;
  } while (bVar16);
  local_68 = 0;
  busy_msleep(200);
  iVar10 = mbedtls_timing_get_delay(local_88);
  uVar11 = CONCAT44(extraout_var,iVar10);
  if (iVar10 == -1) {
    if (verbose != 0) {
      puts("passed");
      printf("  TIMING test #3 (hardclock / get_timer): ");
      uVar11 = (ulong)extraout_var_00 << 0x20;
    }
    bVar16 = true;
    do {
      bVar13 = bVar16;
      uVar14 = rdtsc();
      busy_msleep(1);
      uVar15 = rdtsc();
      uVar14 = (uVar15 & 0xffffffff00000000 | CONCAT44(extraout_var_01,(int)uVar15)) -
               (uVar14 & 0xffffffff00000000 | CONCAT44((int)(uVar11 >> 0x20),(int)uVar14));
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar14;
      auVar4 = auVar3 * ZEXT816(0xcccccccccccccccd);
      auVar6._8_8_ = 4;
      auVar6._0_8_ = 0xcccccccccccccccd;
      uVar15 = 2;
      while( true ) {
        uVar11 = rdtsc();
        busy_msleep(uVar15);
        uVar5 = rdtsc();
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar15;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (CONCAT44(extraout_var_02,(int)uVar5) | uVar5 & 0xffffffff00000000) -
                       (uVar11 & 0xffffffff00000000 | CONCAT44(auVar4._4_4_,(int)uVar11));
        uVar11 = SUB168(auVar2 / auVar1,0);
        auVar4._8_8_ = SUB168(auVar2 % auVar1,0);
        auVar4._0_8_ = uVar11;
        if ((uVar11 < uVar14 - uVar14 / 5) || (SUB168(auVar3 * auVar6,8) >> 2 < uVar11)) break;
        uVar15 = uVar15 + 1;
        if (uVar15 == 5) {
          if (verbose == 0) goto LAB_00144164;
          __s = "passed";
          goto LAB_00144155;
        }
      }
      iVar10 = 0;
      bVar16 = false;
    } while (bVar13);
    if (verbose != 0) {
      __s = "failed (ignored)";
LAB_00144155:
      puts(__s);
      putchar(10);
LAB_00144164:
      iVar10 = 0;
    }
  }
  else {
LAB_0014404f:
    iVar10 = 1;
    if (verbose != 0) {
      puts("failed");
    }
  }
  return iVar10;
}

Assistant:

int mbedtls_timing_self_test( int verbose )
{
    unsigned long cycles, ratio;
    unsigned long millisecs, secs;
    int hardfail;
    struct mbedtls_timing_hr_time hires;
    uint32_t a, b;
    mbedtls_timing_delay_context ctx;

    if( verbose != 0 )
        mbedtls_printf( "  TIMING tests note: will take some time!\n" );


    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #1 (set_alarm / get_timer): " );

    for( secs = 1; secs <= 3; secs++ )
    {
        (void) mbedtls_timing_get_timer( &hires, 1 );

        mbedtls_set_alarm( (int) secs );
        while( !mbedtls_timing_alarmed )
            ;

        millisecs = mbedtls_timing_get_timer( &hires, 0 );

        /* For some reason on Windows it looks like alarm has an extra delay
         * (maybe related to creating a new thread). Allow some room here. */
        if( millisecs < 800 * secs || millisecs > 1200 * secs + 300 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #2 (set/get_delay        ): " );

    for( a = 200; a <= 400; a += 200 )
    {
        for( b = 200; b <= 400; b += 200 )
        {
            mbedtls_timing_set_delay( &ctx, a, a + b );

            busy_msleep( a - a / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 0 )
                FAIL;

            busy_msleep( a / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b - a / 8 - b / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 2 )
                FAIL;
        }
    }

    mbedtls_timing_set_delay( &ctx, 0, 0 );
    busy_msleep( 200 );
    if( mbedtls_timing_get_delay( &ctx ) != -1 )
        FAIL;

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #3 (hardclock / get_timer): " );

    /*
     * Allow one failure for possible counter wrapping.
     * On a 4Ghz 32-bit machine the cycle counter wraps about once per second;
     * since the whole test is about 10ms, it shouldn't happen twice in a row.
     */
    hardfail = 0;

hard_test:
    if( hardfail > 1 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed (ignored)\n" );

        goto hard_test_done;
    }

    /* Get a reference ratio cycles/ms */
    millisecs = 1;
    cycles = mbedtls_timing_hardclock();
    busy_msleep( millisecs );
    cycles = mbedtls_timing_hardclock() - cycles;
    ratio = cycles / millisecs;

    /* Check that the ratio is mostly constant */
    for( millisecs = 2; millisecs <= 4; millisecs++ )
    {
        cycles = mbedtls_timing_hardclock();
        busy_msleep( millisecs );
        cycles = mbedtls_timing_hardclock() - cycles;

        /* Allow variation up to 20% */
        if( cycles / millisecs < ratio - ratio / 5 ||
            cycles / millisecs > ratio + ratio / 5 )
        {
            hardfail++;
            goto hard_test;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

hard_test_done:

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}